

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O3

bool __thiscall
dg::LLVMPointsToSet::const_iterator::operator==(const_iterator *this,const_iterator *rhs)

{
  int iVar1;
  int iVar2;
  raw_ostream *prVar3;
  bool bVar4;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  
  bVar4 = this->impl == (LLVMPointsToSetImpl *)0x0 && rhs->impl == (LLVMPointsToSetImpl *)0x0;
  if (rhs->impl != (LLVMPointsToSetImpl *)0x0 && this->impl != (LLVMPointsToSetImpl *)0x0) {
    prVar3 = (raw_ostream *)llvm::errs();
    Str.Length = 3;
    Str.Data = "CMP";
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
    prVar3 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar3,this->impl);
    Str_00.Length = 1;
    Str_00.Data = "+";
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_00);
    iVar1 = (**(code **)(*(long *)this->impl + 0x30))();
    prVar3 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar3,(long)iVar1);
    Str_01.Length = 4;
    Str_01.Data = " == ";
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_01);
    prVar3 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar3,rhs->impl);
    Str_02.Length = 1;
    Str_02.Data = "+";
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_02);
    iVar1 = (**(code **)(*(long *)rhs->impl + 0x30))();
    prVar3 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar3,(long)iVar1);
    Str_03.Length = 1;
    Str_03.Data = "\n";
    llvm::raw_ostream::operator<<(prVar3,Str_03);
    if (this->impl == rhs->impl) {
      iVar1 = (**(code **)(*(long *)this->impl + 0x30))();
      iVar2 = (**(code **)(*(long *)rhs->impl + 0x30))();
      bVar4 = iVar1 == iVar2;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool operator==(const const_iterator &rhs) const {
            if (!impl)
                return !rhs.impl;
            if (!rhs.impl)
                return !impl;

            assert(!impl->end() && rhs.impl->end());
            assert(impl == rhs.impl &&
                   "Compared unrelated iterators"); // catch bugs
            llvm::errs() << "CMP" << impl << "+" << impl->position()
                         << " == " << rhs.impl << "+" << rhs.impl->position()
                         << "\n";
            return impl == rhs.impl && impl->position() == rhs.impl->position();
        }